

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::PyiGenerator::PrintMessage
          (PyiGenerator *this,Descriptor *message_descriptor,bool is_nested)

{
  ushort *puVar1;
  Printer *pPVar2;
  string_view name;
  string_view name_00;
  string_view name_01;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  FieldDescriptor *pFVar6;
  EnumDescriptor *pEVar7;
  Descriptor *pDVar8;
  FieldDescriptor *pFVar9;
  FieldDescriptor *field_des;
  AlphaNum *b;
  undefined7 in_register_00000011;
  char *extraout_RDX;
  char *pcVar10;
  int i;
  int iVar11;
  lts_20250127 *this_00;
  PyiGenerator *pPVar12;
  string *__return_storage_ptr__;
  char *pcVar13;
  int iVar14;
  string_view s;
  string_view text;
  string_view name_02;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view name_03;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  AlphaNum *args_3;
  PyiGenerator *this_01;
  PyiGenerator *this_02;
  string self_arg_name;
  undefined1 local_170 [48];
  AlphaNum local_140;
  string field_name;
  string field_type;
  string extra_base;
  string_view class_name;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar13 = (char *)CONCAT71(in_register_00000011,is_nested);
  if ((int)pcVar13 == 0) {
    text._M_str = "\n";
    text._M_len = 1;
    io::Printer::Print<>(this->printer_,text);
    pcVar13 = extraout_RDX;
  }
  puVar1 = (ushort *)(message_descriptor->all_names_).payload_;
  class_name._M_len = (size_t)*puVar1;
  class_name._M_str = (char *)((long)puVar1 + ~class_name._M_len);
  extra_base._M_dataplus._M_p = (pointer)&extra_base.field_2;
  extra_base._M_string_length = 0;
  extra_base.field_2._M_local_buf[0] = '\0';
  name_02._M_len = (long)puVar1 + ~(ulong)puVar1[1];
  name_02._M_str = pcVar13;
  bVar3 = IsWellKnownType((python *)(ulong)puVar1[1],name_02);
  if (bVar3) {
    self_arg_name._0_16_ = absl::lts_20250127::NullSafeStringView(", _well_known_types.");
    puVar1 = (ushort *)(message_descriptor->all_names_).payload_;
    field_name._M_dataplus._M_p._2_6_ = 0;
    field_name._M_dataplus._M_p._0_2_ = *puVar1;
    field_name._M_string_length = (long)puVar1 + ~(ulong)field_name._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_170,(lts_20250127 *)&self_arg_name,(AlphaNum *)&field_name,
               (AlphaNum *)field_name._M_string_length);
    std::__cxx11::string::operator=((string *)&extra_base,(string *)local_170);
    std::__cxx11::string::~string((string *)local_170);
  }
  else {
    std::__cxx11::string::assign((char *)&extra_base);
  }
  args_3 = (AlphaNum *)&extra_base;
  pcVar13 = "extra_base";
  text_00._M_str = "class $class_name$(_message.Message$extra_base$):\n";
  text_00._M_len = 0x32;
  io::Printer::
  Print<char[11],std::basic_string_view<char,std::char_traits<char>>,char[11],std::__cxx11::string>
            (this->printer_,text_00,(char (*) [11])0xfe747e,&class_name,(char (*) [11])"extra_base",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&self_arg_name,"class_name",(allocator<char> *)&field_name);
  this_01 = this;
  Annotate<google::protobuf::Descriptor>(this,&self_arg_name,message_descriptor);
  std::__cxx11::string::~string((string *)&self_arg_name);
  pPVar2 = this->printer_;
  pPVar2->indent_ = pPVar2->indent_ + (pPVar2->options_).spaces_per_indent;
  text_01._M_str = "__slots__ = (";
  text_01._M_len = 0xd;
  io::Printer::Print<>(pPVar2,text_01);
  iVar14 = 0;
  for (iVar11 = 0; iVar11 < message_descriptor->field_count_; iVar11 = iVar11 + 1) {
    pFVar6 = Descriptor::field(message_descriptor,iVar11);
    name._M_str = (char *)this_01;
    name._M_len = (size_t)args_3;
    bVar3 = IsPythonKeyword(name);
    if (!bVar3) {
      if (0 < iVar14) {
        text_02._M_str = ", ";
        text_02._M_len = 2;
        io::Printer::Print<>(this_01->printer_,text_02);
      }
      puVar1 = (ushort *)(pFVar6->all_names_).payload_;
      self_arg_name._M_dataplus._M_p._2_6_ = 0;
      self_arg_name._M_dataplus._M_p._0_2_ = *puVar1;
      self_arg_name._M_string_length = (long)puVar1 + ~(ulong)self_arg_name._M_dataplus._M_p;
      text_03._M_str = "\"$field_name$\"";
      text_03._M_len = 0xe;
      io::Printer::Print<char[11],std::basic_string_view<char,std::char_traits<char>>>
                (this_01->printer_,text_03,(char (*) [11])0x1026cd3,
                 (basic_string_view<char,_std::char_traits<char>_> *)&self_arg_name);
      iVar14 = iVar14 + 1;
    }
  }
  pcVar10 = ")\n";
  if (iVar14 == 1) {
    pcVar10 = ",)\n";
  }
  text_04._M_len = (ulong)(iVar14 == 1) | 2;
  text_04._M_str = pcVar10;
  io::Printer::Print<>(this_01->printer_,text_04);
  if (0 < message_descriptor->extension_range_count_) {
    text_05._M_str = "Extensions: _python_message._ExtensionDict\n";
    text_05._M_len = 0x2b;
    io::Printer::Print<>(this_01->printer_,text_05);
  }
  for (iVar11 = 0; iVar11 < message_descriptor->enum_type_count_; iVar11 = iVar11 + 1) {
    pEVar7 = Descriptor::enum_type(message_descriptor,iVar11);
    PrintEnum(this_01,pEVar7);
    pEVar7 = Descriptor::enum_type(message_descriptor,iVar11);
    PrintEnumValues(this_01,pEVar7,false);
  }
  for (iVar11 = 0; iVar11 < message_descriptor->nested_type_count_; iVar11 = iVar11 + 1) {
    pDVar8 = Descriptor::nested_type(message_descriptor,iVar11);
    PrintMessage(this_01,pDVar8,true);
  }
  PrintExtensions<google::protobuf::Descriptor>(this_01,message_descriptor);
  for (iVar11 = 0; iVar14 = message_descriptor->field_count_, iVar11 < iVar14; iVar11 = iVar11 + 1)
  {
    pFVar6 = Descriptor::field(message_descriptor,iVar11);
    pPVar2 = this_01->printer_;
    puVar1 = (ushort *)(pFVar6->all_names_).payload_;
    this_00 = (lts_20250127 *)(ulong)*puVar1;
    s._M_len = (long)puVar1 + ~(ulong)this_00;
    s._M_str = (char *)this_01;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_((string *)&local_140,this_00,s);
    self_arg_name._M_string_length = local_140.piece_._M_len;
    self_arg_name._M_dataplus._M_p = local_140.piece_._M_str;
    b = (AlphaNum *)local_140.piece_._M_str;
    field_name._0_16_ = absl::lts_20250127::NullSafeStringView("_FIELD_NUMBER");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_170,(lts_20250127 *)&self_arg_name,(AlphaNum *)&field_name,b);
    text_06._M_str = "$field_number_name$: _ClassVar[int]\n";
    text_06._M_len = 0x24;
    io::Printer::Print<char[18],std::__cxx11::string>
              (pPVar2,text_06,(char (*) [18])"field_number_name",(string *)local_170);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)&local_140);
  }
  for (iVar11 = 0; iVar11 < iVar14; iVar11 = iVar11 + 1) {
    pFVar6 = Descriptor::field(message_descriptor,iVar11);
    name_00._M_str = (char *)this_01;
    name_00._M_len = (size_t)args_3;
    bVar3 = IsPythonKeyword(name_00);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&field_type,anon_var_dwarf_651463 + 5,(allocator<char> *)&self_arg_name);
      bVar3 = FieldDescriptor::is_map(pFVar6);
      if (bVar3) {
        pDVar8 = FieldDescriptor::message_type(pFVar6);
        pFVar9 = Descriptor::field(pDVar8,0);
        pDVar8 = FieldDescriptor::message_type(pFVar6);
        field_des = Descriptor::field(pDVar8,1);
        pcVar10 = "_containers.MessageMap[";
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field_des->type_ * 4) != 10) {
          pcVar10 = "_containers.ScalarMap[";
        }
        self_arg_name._0_16_ = absl::lts_20250127::NullSafeStringView(pcVar10);
        pPVar12 = this_01;
        GetFieldType_abi_cxx11_(&local_70,this_01,pFVar9,message_descriptor);
        field_name._M_string_length = (size_type)local_70._M_dataplus._M_p;
        field_name._M_dataplus._M_p = (pointer)local_70._M_string_length;
        local_170._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView(", ");
        GetFieldType_abi_cxx11_(&local_90,this_01,field_des,message_descriptor);
        local_140.piece_._M_len = local_90._M_string_length;
        local_140.piece_._M_str = local_90._M_dataplus._M_p;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_50,(lts_20250127 *)&self_arg_name,(AlphaNum *)&field_name,
                   (AlphaNum *)local_170,&local_140,(AlphaNum *)pcVar13);
        std::__cxx11::string::operator=((string *)&field_type,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        __return_storage_ptr__ = &local_70;
        this_01 = pPVar12;
      }
      else {
        bVar3 = FieldDescriptor::is_repeated(pFVar6);
        if (bVar3) {
          std::__cxx11::string::assign((char *)&field_type);
        }
        __return_storage_ptr__ = &self_arg_name;
        GetFieldType_abi_cxx11_(__return_storage_ptr__,this_01,pFVar6,message_descriptor);
        std::__cxx11::string::append((string *)&field_type);
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      bVar3 = FieldDescriptor::is_repeated(pFVar6);
      if (bVar3) {
        self_arg_name._0_16_ = absl::lts_20250127::NullSafeStringView("]");
        absl::lts_20250127::StrAppend(&field_type,(AlphaNum *)&self_arg_name);
      }
      puVar1 = (ushort *)(pFVar6->all_names_).payload_;
      self_arg_name._M_dataplus._M_p._2_6_ = 0;
      self_arg_name._M_dataplus._M_p._0_2_ = *puVar1;
      self_arg_name._M_string_length = (long)puVar1 + ~(ulong)self_arg_name._M_dataplus._M_p;
      args_3 = (AlphaNum *)&field_type;
      pcVar13 = "type";
      text_07._M_str = "$name$: $type$\n";
      text_07._M_len = 0xf;
      io::Printer::
      Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[5],std::__cxx11::string>
                (this_01->printer_,text_07,(char (*) [5])0xd8d1e3,
                 (basic_string_view<char,_std::char_traits<char>_> *)&self_arg_name,
                 (char (*) [5])0xde104b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&self_arg_name,"name",(allocator<char> *)&field_name);
      Annotate<google::protobuf::FieldDescriptor>(this_01,&self_arg_name,pFVar6);
      std::__cxx11::string::~string((string *)&self_arg_name);
      std::__cxx11::string::~string((string *)&field_type);
    }
    iVar14 = message_descriptor->field_count_;
  }
  text_08._M_str = "def __init__(";
  text_08._M_len = 0xd;
  io::Printer::Print<>(this_01->printer_,text_08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&self_arg_name,"self",(allocator<char> *)&field_name);
  while( true ) {
    name_03._M_str = self_arg_name._M_dataplus._M_p;
    name_03._M_len = self_arg_name._M_string_length;
    pFVar6 = Descriptor::FindFieldByName(message_descriptor,name_03);
    if (pFVar6 == (FieldDescriptor *)0x0) break;
    std::__cxx11::string::append((char *)&self_arg_name);
  }
  text_09._M_str = self_arg_name._M_dataplus._M_p;
  text_09._M_len = self_arg_name._M_string_length;
  io::Printer::Print<>(this_01->printer_,text_09);
  bVar3 = false;
  for (iVar11 = 0; iVar11 < message_descriptor->field_count_; iVar11 = iVar11 + 1) {
    pFVar6 = Descriptor::field(message_descriptor,iVar11);
    name_01._M_str = (char *)this_01;
    name_01._M_len = (size_t)args_3;
    bVar4 = IsPythonKeyword(name_01);
    bVar5 = true;
    if (!bVar4) {
      puVar1 = (ushort *)(pFVar6->all_names_).payload_;
      local_170._0_8_ = CONCAT62(0,*puVar1);
      local_170._8_8_ = (char *)((long)puVar1 + ~local_170._0_8_);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&field_name,(basic_string_view<char,_std::char_traits<char>_> *)local_170
                 ,(allocator<char> *)&local_140);
      text_10._M_str = ", $field_name$: ";
      text_10._M_len = 0x10;
      io::Printer::Print<char[11],std::__cxx11::string>
                (this_01->printer_,text_10,(char (*) [11])0x1026cd3,&field_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_170,"field_name",(allocator<char> *)&local_140);
      pPVar12 = (PyiGenerator *)local_170;
      Annotate<google::protobuf::FieldDescriptor>(this_01,(string *)local_170,pFVar6);
      std::__cxx11::string::~string((string *)local_170);
      bVar5 = FieldDescriptor::is_repeated(pFVar6);
      if ((bVar5) ||
         (this_02 = this_01,
         *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar6->type_ * 4) != 7)) {
        pPVar12 = (PyiGenerator *)&DAT_0000000a;
        text_11._M_str = "_Optional[";
        text_11._M_len = 10;
        io::Printer::Print<>(this_01->printer_,text_11);
        this_02 = this_01;
      }
      bVar5 = FieldDescriptor::is_map(pFVar6);
      if (bVar5) {
        pDVar8 = FieldDescriptor::message_type(pFVar6);
        pPVar2 = this_02->printer_;
        this_01 = this_02;
        pFVar9 = Descriptor::field(pDVar8,0);
        GetFieldType_abi_cxx11_((string *)local_170,this_02,pFVar9,message_descriptor);
        pFVar9 = Descriptor::field(pDVar8,1);
        GetFieldType_abi_cxx11_((string *)&local_140,this_01,pFVar9,message_descriptor);
        text_12._M_str = "_Mapping[$key_type$, $value_type$]";
        text_12._M_len = 0x22;
        args_3 = &local_140;
        io::Printer::Print<char[9],std::__cxx11::string,char[11],std::__cxx11::string>
                  (pPVar2,text_12,(char (*) [9])0xe2196a,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                   (char (*) [11])0xe21981,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)local_170);
      }
      else {
        bVar5 = FieldDescriptor::is_repeated(pFVar6);
        if (bVar5) {
          pPVar12 = (PyiGenerator *)&DAT_0000000a;
          text_13._M_str = "_Iterable[";
          text_13._M_len = 10;
          io::Printer::Print<>(this_02->printer_,text_13);
        }
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar6->type_ * 4) == 8) {
          pPVar2 = this_02->printer_;
          this_01 = this_02;
          pEVar7 = FieldDescriptor::enum_type(pFVar6);
          ModuleLevelName<google::protobuf::EnumDescriptor>((string *)local_170,this_02,pEVar7);
          text_15._M_str = "_Union[$type_name$, str]";
          text_15._M_len = 0x18;
          io::Printer::Print<char[10],std::__cxx11::string>
                    (pPVar2,text_15,(char (*) [10])0x10a7a78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170)
          ;
        }
        else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar6->type_ * 4) == 10) {
          pDVar8 = FieldDescriptor::message_type(pFVar6);
          ExtraInitTypes_abi_cxx11_((string *)local_170,pPVar12,pDVar8);
          pPVar2 = this_02->printer_;
          GetFieldType_abi_cxx11_((string *)&local_140,this_02,pFVar6,message_descriptor);
          text_14._M_str = "_Union[$extra_init_types$$type_name$, _Mapping]";
          text_14._M_len = 0x2f;
          args_3 = &local_140;
          io::Printer::Print<char[17],std::__cxx11::string,char[10],std::__cxx11::string>
                    (pPVar2,text_14,(char (*) [17])"extra_init_types",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     (char (*) [10])0x10a7a78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140
                    );
          std::__cxx11::string::~string((string *)&local_140);
          this_01 = this_02;
        }
        else {
          pPVar2 = this_02->printer_;
          GetFieldType_abi_cxx11_((string *)local_170,this_02,pFVar6,message_descriptor);
          text_16._M_str = "$type_name$";
          text_16._M_len = 0xb;
          io::Printer::Print<char[10],std::__cxx11::string>
                    (pPVar2,text_16,(char (*) [10])0x10a7a78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170)
          ;
          this_01 = this_02;
        }
        std::__cxx11::string::~string((string *)local_170);
        bVar5 = FieldDescriptor::is_repeated(pFVar6);
        if (bVar5) {
          text_17._M_str = "]";
          text_17._M_len = 1;
          io::Printer::Print<>(this_01->printer_,text_17);
        }
      }
      bVar5 = FieldDescriptor::is_repeated(pFVar6);
      if ((bVar5) || (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar6->type_ * 4) != 7))
      {
        text_18._M_str = "]";
        text_18._M_len = 1;
        io::Printer::Print<>(this_01->printer_,text_18);
      }
      text_19._M_str = " = ...";
      text_19._M_len = 6;
      io::Printer::Print<>(this_01->printer_,text_19);
      std::__cxx11::string::~string((string *)&field_name);
      bVar5 = bVar3;
    }
    bVar3 = bVar5;
  }
  if (bVar3) {
    text_20._M_str = ", **kwargs";
    text_20._M_len = 10;
    io::Printer::Print<>(this_01->printer_,text_20);
  }
  text_21._M_str = ") -> None: ...\n";
  text_21._M_len = 0xf;
  io::Printer::Print<>(this_01->printer_,text_21);
  io::Printer::Outdent(this_01->printer_);
  std::__cxx11::string::~string((string *)&self_arg_name);
  std::__cxx11::string::~string((string *)&extra_base);
  return;
}

Assistant:

void PyiGenerator::PrintMessage(const Descriptor& message_descriptor,
                                bool is_nested) const {
  if (!is_nested) {
    printer_->Print("\n");
  }
  const absl::string_view class_name = message_descriptor.name();
  std::string extra_base;
  // A well-known type needs to inherit from its corresponding base class in
  // net/proto2/python/internal/well_known_types.
  if (IsWellKnownType(message_descriptor.full_name())) {
    extra_base =
        absl::StrCat(", _well_known_types.", message_descriptor.name());
  } else {
    extra_base = "";
  }
  printer_->Print("class $class_name$(_message.Message$extra_base$):\n",
                  "class_name", class_name, "extra_base", extra_base);
  Annotate("class_name", &message_descriptor);
  printer_->Indent();

  // Prints slots
  printer_->Print("__slots__ = (");
  int items_printed = 0;
  for (int i = 0; i < message_descriptor.field_count(); ++i) {
    const FieldDescriptor* field_des = message_descriptor.field(i);
    if (IsPythonKeyword(field_des->name())) {
      continue;
    }
    if (items_printed > 0) {
      printer_->Print(", ");
    }
    ++items_printed;
    printer_->Print("\"$field_name$\"", "field_name", field_des->name());
  }
  printer_->Print(items_printed == 1 ? ",)\n" : ")\n");

  // Prints Extensions for extendable messages
  if (message_descriptor.extension_range_count() > 0) {
    printer_->Print("Extensions: _python_message._ExtensionDict\n");
  }

  // Prints nested enums
  for (int i = 0; i < message_descriptor.enum_type_count(); ++i) {
    PrintEnum(*message_descriptor.enum_type(i));
    PrintEnumValues(*message_descriptor.enum_type(i));
  }

  // Prints nested messages
  for (int i = 0; i < message_descriptor.nested_type_count(); ++i) {
    PrintMessage(*message_descriptor.nested_type(i), true);
  }

  PrintExtensions(message_descriptor);

  // Prints field number
  for (int i = 0; i < message_descriptor.field_count(); ++i) {
    const FieldDescriptor& field_des = *message_descriptor.field(i);
    printer_->Print(
        "$field_number_name$: _ClassVar[int]\n", "field_number_name",
        absl::StrCat(absl::AsciiStrToUpper(field_des.name()), "_FIELD_NUMBER"));
  }
  // Prints field name and type
  for (int i = 0; i < message_descriptor.field_count(); ++i) {
    const FieldDescriptor& field_des = *message_descriptor.field(i);
    if (IsPythonKeyword(field_des.name())) {
      continue;
    }
    std::string field_type = "";
    if (field_des.is_map()) {
      const FieldDescriptor* key_des = field_des.message_type()->field(0);
      const FieldDescriptor* value_des = field_des.message_type()->field(1);
      field_type =
          absl::StrCat(value_des->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE
                           ? "_containers.MessageMap["
                           : "_containers.ScalarMap[",
                       GetFieldType(*key_des, message_descriptor), ", ",
                       GetFieldType(*value_des, message_descriptor));
    } else {
      if (field_des.is_repeated()) {
        field_type = (field_des.cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE
                          ? "_containers.RepeatedCompositeFieldContainer["
                          : "_containers.RepeatedScalarFieldContainer[");
      }
      field_type += GetFieldType(field_des, message_descriptor);
    }

    if (field_des.is_repeated()) {
      absl::StrAppend(&field_type, "]");
    }
    printer_->Print("$name$: $type$\n",
                    "name", field_des.name(), "type", field_type);
    Annotate("name", &field_des);
  }

  // Prints __init__
  printer_->Print("def __init__(");
  // If the message has a field named "self" (see b/144146793), it can still be
  // passed to the initializer, which takes those as **kwargs. To avoid name
  // collision, we rename the self parameter by appending underscores until it
  // no longer collides. The self-parameter is in fact positional-only, so the
  // name in the pyi doesn't matter with regard to what runtime usage is valid.
  std::string self_arg_name = "self";
  while (message_descriptor.FindFieldByName(self_arg_name) != nullptr) {
    self_arg_name.append("_");
  }
  printer_->Print(self_arg_name);
  bool has_python_keywords = false;
  for (int i = 0; i < message_descriptor.field_count(); ++i) {
    const FieldDescriptor* field_des = message_descriptor.field(i);
    if (IsPythonKeyword(field_des->name())) {
      has_python_keywords = true;
      continue;
    }
    std::string field_name = std::string(field_des->name());
    printer_->Print(", $field_name$: ", "field_name", field_name);
    Annotate("field_name", field_des);
    if (field_des->is_repeated() ||
        field_des->cpp_type() != FieldDescriptor::CPPTYPE_BOOL) {
      printer_->Print("_Optional[");
    }
    if (field_des->is_map()) {
      const Descriptor* map_entry = field_des->message_type();
      printer_->Print(
          "_Mapping[$key_type$, $value_type$]", "key_type",
          GetFieldType(*map_entry->field(0), message_descriptor),
          "value_type",
          GetFieldType(*map_entry->field(1), message_descriptor));
    } else {
      if (field_des->is_repeated()) {
        printer_->Print("_Iterable[");
      }
      if (field_des->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        const auto& extra_init_types =
            ExtraInitTypes(*field_des->message_type());
        printer_->Print("_Union[$extra_init_types$$type_name$, _Mapping]",
                        "extra_init_types", extra_init_types, "type_name",
                        GetFieldType(*field_des, message_descriptor));
      } else {
        if (field_des->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
          printer_->Print("_Union[$type_name$, str]", "type_name",
                          ModuleLevelName(*field_des->enum_type()));
        } else {
          printer_->Print(
              "$type_name$", "type_name",
              GetFieldType(*field_des, message_descriptor));
        }
      }
      if (field_des->is_repeated()) {
        printer_->Print("]");
      }
    }
    if (field_des->is_repeated() ||
        field_des->cpp_type() != FieldDescriptor::CPPTYPE_BOOL) {
      printer_->Print("]");
    }
    printer_->Print(" = ...");
  }
  if (has_python_keywords) {
    printer_->Print(", **kwargs");
  }
  printer_->Print(") -> None: ...\n");
  printer_->Outdent();
}